

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cpp
# Opt level: O2

Variable __thiscall
LiteScript::_Type_CALLBACK::ONotEqual(_Type_CALLBACK *this,Variable *obj1,Variable *obj2)

{
  Callback *this_00;
  bool bVar1;
  Object *pOVar2;
  Type *this_01;
  Type *t;
  Variable *in_RCX;
  uint *extraout_RDX;
  Variable VVar3;
  
  pOVar2 = Variable::operator->(obj2);
  Memory::Create((Memory *)this,(Type *)pOVar2->memory);
  pOVar2 = Variable::operator->(obj2);
  this_01 = Object::GetType(pOVar2);
  pOVar2 = Variable::operator->(in_RCX);
  t = Object::GetType(pOVar2);
  bVar1 = Type::operator==(this_01,t);
  if (bVar1) {
    pOVar2 = Variable::operator->(obj2);
    this_00 = (Callback *)pOVar2->data;
    pOVar2 = Variable::operator->(in_RCX);
    bVar1 = Callback::operator!=(this_00,(Callback *)pOVar2->data);
  }
  else {
    bVar1 = false;
  }
  pOVar2 = Variable::operator->((Variable *)this);
  *(bool *)pOVar2->data = bVar1;
  VVar3.nb_ref = extraout_RDX;
  VVar3.obj = (Object *)this;
  return VVar3;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CALLBACK::ONotEqual(const Variable &obj1, const Variable &obj2) const {
    Variable result = obj1->memory.Create(Type::BOOLEAN);
    result->GetData<bool>() = (obj1->GetType() == obj2->GetType() && obj1->GetData<Callback>() != obj2->GetData<Callback>());
    return result;
}